

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_tanh_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  undefined1 auVar3 [12];
  uint uVar4;
  undefined8 uVar5;
  uint64_t uVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  floatx80 fVar10;
  floatx80 fVar11;
  floatx80 fVar12;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  
  fVar10.low = a.low;
  uVar9 = a._8_4_;
  auVar3 = a._0_12_;
  if ((~uVar9 & 0x7fff) == 0) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      a_00._12_4_ = 0;
      a_00.low = auVar3._0_8_;
      a_00.high = auVar3._8_2_;
      a_00._10_2_ = auVar3._10_2_;
      fVar10 = propagateFloatx80NaNOneArg(a_00,status);
      return fVar10;
    }
    uVar9 = uVar9 & 0xbfff;
    uVar5 = 0x8000000000000000;
  }
  else {
    uVar8 = uVar9 & 0x7fff;
    if (fVar10.low == 0 && ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0
       ) {
      uVar5 = 0;
    }
    else {
      cVar1 = status->float_rounding_mode;
      cVar2 = status->floatx80_rounding_precision;
      status->float_rounding_mode = '\0';
      status->floatx80_rounding_precision = 'P';
      if (uVar8 * 0x10000 + (uint)a.low._6_2_ + 0xc0002231 < 0xffd7a231) {
        uVar4 = uVar8 * 0x10000 | (uint)a.low._6_2_;
        if (uVar4 < 0x3fff8000) {
          status->float_rounding_mode = cVar1;
          status->floatx80_rounding_precision = cVar2;
          a_01._12_4_ = 0;
          a_01.low = auVar3._0_8_;
          a_01.high = auVar3._8_2_;
          a_01._10_2_ = auVar3._10_2_;
          fVar10 = floatx80_move_m68k(a_01,status);
          auVar3 = fVar10._0_12_;
        }
        else {
          if (uVar4 < 0x40048aa2) {
            a_03._8_4_ = uVar8 + 1;
            a_03.low = fVar10.low;
            a_03._12_4_ = 0;
            fVar10 = floatx80_etox_m68k(a_03,status);
            fVar11 = float32_to_floatx80_m68k(0x3f800000,status);
            b_01._8_8_ = fVar11._8_8_ & 0xffffffff;
            auVar3 = fVar10._0_12_;
            a_04._12_4_ = 0;
            a_04.low = auVar3._0_8_;
            a_04.high = auVar3._8_2_;
            a_04._10_2_ = auVar3._10_2_;
            b_01.low = fVar11.low;
            fVar10 = floatx80_add_m68k(a_04,b_01,status);
            uVar9 = (uVar9 & 0x8000) << 0x10;
            fVar11 = float32_to_floatx80_m68k(uVar9 ^ 0xc0000000,status);
            auVar3 = fVar11._0_12_;
            a_05._12_4_ = 0;
            a_05.low = auVar3._0_8_;
            a_05.high = auVar3._8_2_;
            a_05._10_2_ = auVar3._10_2_;
            auVar3 = fVar10._0_12_;
            b_02._12_4_ = 0;
            b_02.low = auVar3._0_8_;
            b_02.high = auVar3._8_2_;
            b_02._10_2_ = auVar3._10_2_;
            fVar10 = floatx80_div_m68k(a_05,b_02,status);
            uVar6 = fVar10.low;
            uVar7 = fVar10._8_4_;
            fVar10 = float32_to_floatx80_m68k(uVar9 | 0x3f800000,status);
            status->float_rounding_mode = cVar1;
            status->floatx80_rounding_precision = cVar2;
          }
          else {
            uVar9 = (uVar9 & 0x8000) * 0x10000;
            fVar10 = float32_to_floatx80_m68k(uVar9 + 0x3f800000,status);
            uVar6 = fVar10.low;
            uVar7 = fVar10._8_4_;
            status->float_rounding_mode = cVar1;
            status->floatx80_rounding_precision = cVar2;
            fVar10 = float32_to_floatx80_m68k(uVar9 ^ 0x80800000,status);
          }
          b_03._8_8_ = fVar10._8_8_ & 0xffffffff;
          a_06._8_4_ = uVar7;
          a_06.low = uVar6;
          a_06._12_4_ = 0;
          b_03.low = fVar10.low;
          fVar10 = floatx80_add_m68k(a_06,b_03,status);
          auVar3 = fVar10._0_12_;
        }
      }
      else {
        fVar10._8_4_ = uVar8 + 1;
        fVar10._12_4_ = 0;
        fVar10 = floatx80_etoxm1_m68k(fVar10,status);
        fVar11 = float32_to_floatx80_m68k(0x40000000,status);
        b._8_8_ = fVar11._8_8_ & 0xffffffff;
        auVar3 = fVar10._0_12_;
        a_02._12_4_ = 0;
        a_02.low = auVar3._0_8_;
        a_02.high = auVar3._8_2_;
        a_02._10_2_ = auVar3._10_2_;
        b.low = fVar11.low;
        fVar10 = floatx80_add_m68k(a_02,b,status);
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        fVar11._12_4_ = 0;
        fVar11.low = auVar3._0_8_;
        fVar11.high = auVar3._8_2_;
        fVar11._10_2_ = auVar3._10_2_;
        b_00._8_4_ = uVar9 & 0xffff8000 ^ fVar10._8_4_;
        b_00.low = fVar10.low;
        b_00._12_4_ = 0;
        fVar10 = floatx80_div_m68k(fVar11,b_00,status);
        auVar3 = fVar10._0_12_;
      }
      uVar5 = auVar3._0_8_;
      uVar9 = auVar3._8_4_;
      float_raise_m68k(' ',status);
    }
  }
  fVar12._8_4_ = uVar9;
  fVar12.low = uVar5;
  fVar12._12_4_ = 0;
  return fVar12;
}

Assistant:

floatx80 floatx80_tanh(floatx80 a, float_status *status)
{
    flag aSign, vSign;
    int32_t aExp, vExp;
    uint64_t aSig, vSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact;
    floatx80 fp0, fp1;
    uint32_t sign;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        return packFloatx80(aSign, one_exp, one_sig);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    compact = floatx80_make_compact(aExp, aSig);

    if (compact < 0x3FD78000 || compact > 0x3FFFDDCE) {
        /* TANHBORS */
        if (compact < 0x3FFF8000) {
            /* TANHSM */
            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_move(a, status);

            float_raise(float_flag_inexact, status);

            return a;
        } else {
            if (compact > 0x40048AA1) {
                /* TANHHUGE */
                sign = 0x3F800000;
                sign |= aSign ? 0x80000000 : 0x00000000;
                fp0 = float32_to_floatx80(make_float32(sign), status);
                sign &= 0x80000000;
                sign ^= 0x80800000; /* -SIGN(X)*EPS */

                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_add(fp0, float32_to_floatx80(make_float32(sign),
                                 status), status);

                float_raise(float_flag_inexact, status);

                return a;
            } else {
                fp0 = packFloatx80(0, aExp + 1, aSig); /* Y = 2|X| */
                fp0 = floatx80_etox(fp0, status); /* FP0 IS EXP(Y) */
                fp0 = floatx80_add(fp0, float32_to_floatx80(
                                   make_float32(0x3F800000),
                                   status), status); /* EXP(Y)+1 */
                sign = aSign ? 0x80000000 : 0x00000000;
                fp1 = floatx80_div(float32_to_floatx80(make_float32(
                                   sign ^ 0xC0000000), status), fp0,
                                   status); /* -SIGN(X)*2 / [EXP(Y)+1] */
                fp0 = float32_to_floatx80(make_float32(sign | 0x3F800000),
                                          status); /* SIGN */

                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_add(fp1, fp0, status);

                float_raise(float_flag_inexact, status);

                return a;
            }
        }
    } else { /* 2**(-40) < |X| < (5/2)LOG2 */
        fp0 = packFloatx80(0, aExp + 1, aSig); /* Y = 2|X| */
        fp0 = floatx80_etoxm1(fp0, status); /* FP0 IS Z = EXPM1(Y) */
        fp1 = floatx80_add(fp0, float32_to_floatx80(make_float32(0x40000000),
                           status),
                           status); /* Z+2 */

        vSign = extractFloatx80Sign(fp1);
        vExp = extractFloatx80Exp(fp1);
        vSig = extractFloatx80Frac(fp1);

        fp1 = packFloatx80(vSign ^ aSign, vExp, vSig);

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_div(fp0, fp1, status);

        float_raise(float_flag_inexact, status);

        return a;
    }
}